

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     PrintSmartPointer<unsigned_char[],std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *ptr,ostream *os,
               char param_3)

{
  long lVar1;
  char *pcVar2;
  
  if ((ptr->_M_t).super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
    pcVar2 = "(nullptr)";
    lVar1 = 9;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    os = std::ostream::_M_insert<void_const*>(os);
    pcVar2 = ")";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}